

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_gen.c
# Opt level: O1

iogen_oprnd *
gen_operand(iogen_oprnd *__return_storage_ptr__,dill_reg src_reg,size_t offset,int size,
           FMdata_type data_type,int aligned,int byte_swap)

{
  __return_storage_ptr__->address = 1;
  __return_storage_ptr__->size = size;
  __return_storage_ptr__->data_type = data_type;
  __return_storage_ptr__->offset = offset;
  __return_storage_ptr__->aligned = aligned;
  __return_storage_ptr__->byte_swap = byte_swap;
  __return_storage_ptr__->vc_reg = src_reg;
  __return_storage_ptr__->vc_reg2 = src_reg;
  return __return_storage_ptr__;
}

Assistant:

iogen_oprnd
gen_operand(dill_reg src_reg, size_t offset, int size, FMdata_type data_type, int aligned, int byte_swap)
{
    iogen_oprnd ret_val;
    ret_val.address = 1;
    ret_val.size = size;
    ret_val.data_type = data_type;
    ret_val.offset = offset;
    ret_val.aligned = aligned;
    ret_val.byte_swap = byte_swap;
    ret_val.vc_reg = src_reg;
    ret_val.vc_reg2 = src_reg;
    return ret_val;
}